

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O2

Accel * __thiscall
embree::BVH4Factory::BVH4Triangle4iMB
          (BVH4Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  bool bVar1;
  BVHN<4> *this_00;
  Builder *builder;
  AccelInstance *this_01;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Intersectors intersectors;
  
  this_00 = (BVHN<4> *)BVHN<4>::operator_new(0x240);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&TriangleMi<4>::type,scene);
  intersectors.intersector1.intersect = (IntersectFunc)0x0;
  intersectors.intersector1.occluded = (OccludedFunc)0x0;
  intersectors.collider.collide = (CollideFunc)0x0;
  intersectors.collider.name = (char *)0x0;
  intersectors.ptr = (AccelData *)0x0;
  intersectors.leafIntersector = (void *)0x0;
  memset(&intersectors.intersector1.name,0,0xe0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(scene->super_AccelN).field_0x188 + 0xb0),"default");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0xb0),"fast");
    ivariant = FAST;
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)&(scene->super_AccelN).field_0x188 + 0xb0),"robust");
      if (!bVar1) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+(&bStack_188,"unknown traverser ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0xb0));
        std::operator+(&local_168,&bStack_188," for BVH4<Triangle4iMB>");
        *puVar2 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar2 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&local_168);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      ivariant = ROBUST;
    }
  }
  BVH4Triangle4iMBIntersectors(&intersectors,this,this_00,ivariant);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(scene->super_AccelN).field_0x188 + 0x90),"default");
  if (bVar1) {
    if (bvariant != STATIC) {
      builder = (Builder *)0x0;
      goto LAB_0040c153;
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0x90),
                            "internal_time_splits");
    if (!bVar1) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::operator+(&bStack_188,"unknown builder ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)&(scene->super_AccelN).field_0x188 + 0x90));
      std::operator+(&local_168,&bStack_188," for BVH4<Triangle4iMB>");
      *puVar2 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar2 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&local_168);
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  builder = (*this->BVH4Triangle4iMBSceneBuilderSAH)(this_00,scene,0);
LAB_0040c153:
  this_01 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_01,(AccelData *)this_00,builder,&intersectors);
  return &this_01->super_Accel;
}

Assistant:

Accel* BVH4Factory::BVH4Triangle4iMB(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH4* accel = new BVH4(Triangle4i::type,scene);

    Accel::Intersectors intersectors;
    if      (scene->device->tri_traverser_mb == "default") intersectors = BVH4Triangle4iMBIntersectors(accel,ivariant);
    else if (scene->device->tri_traverser_mb == "fast"   ) intersectors = BVH4Triangle4iMBIntersectors(accel,IntersectVariant::FAST);
    else if (scene->device->tri_traverser_mb == "robust" ) intersectors = BVH4Triangle4iMBIntersectors(accel,IntersectVariant::ROBUST);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown traverser "+scene->device->tri_traverser_mb+" for BVH4<Triangle4iMB>");

    Builder* builder = nullptr;
    if (scene->device->tri_builder_mb == "default") {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH4Triangle4iMBSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : assert(false); break; // FIXME: implement
      case BuildVariant::HIGH_QUALITY: assert(false); break;
      }
    }
    else  if (scene->device->tri_builder_mb == "internal_time_splits") builder = BVH4Triangle4iMBSceneBuilderSAH(accel,scene,0);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->tri_builder_mb+" for BVH4<Triangle4iMB>");

    return new AccelInstance(accel,builder,intersectors);
  }